

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeRange.cpp
# Opt level: O0

bool FIX::TimeRange::isInSameRange(DateTime *start,DateTime *end,DateTime *time1,DateTime *time2)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  long local_90;
  long delta;
  UtcTimeOnly time2TimeOnly;
  int sessionLength;
  undefined1 local_60 [8];
  UtcDate time2Date;
  UtcDate time1Date;
  DateTime *time2_local;
  DateTime *time1_local;
  DateTime *end_local;
  DateTime *start_local;
  
  bVar1 = isInRange(start,end,time1);
  if (bVar1) {
    bVar1 = isInRange(start,end,time2);
    if (bVar1) {
      bVar1 = FIX::operator==(time1,time2);
      if (bVar1) {
        start_local._7_1_ = true;
      }
      else {
        bVar1 = operator<(start,end);
        if ((!bVar1) && (bVar1 = FIX::operator==(start,end), !bVar1)) {
          iVar2 = FIX::operator-(start,end);
          time2TimeOnly.super_DateTime.m_time._0_4_ = 0x15180 - iVar2;
          bVar1 = operator>(time1,time2);
          if (!bVar1) {
            iVar2 = FIX::operator-(time2,time1);
            return iVar2 < (int)time2TimeOnly.super_DateTime.m_time;
          }
          UtcTimeOnly::UtcTimeOnly((UtcTimeOnly *)&delta,time2);
          iVar2 = FIX::operator-((DateTime *)&delta,start);
          local_90 = (long)iVar2;
          if (local_90 < 0) {
            if (local_90 < 1) {
              local_90 = -local_90;
            }
            local_90 = 0x15180 - local_90;
          }
          iVar2 = FIX::operator-(time1,time2);
          lVar3 = (long)(int)time2TimeOnly.super_DateTime.m_time;
          UtcTimeOnly::~UtcTimeOnly((UtcTimeOnly *)&delta);
          return (long)iVar2 < lVar3 - local_90;
        }
        UtcDate::UtcDate((UtcDate *)&time2Date.super_DateTime.m_time,time1);
        UtcDate::UtcDate((UtcDate *)local_60,time2);
        start_local._7_1_ =
             FIX::operator==((DateTime *)&time2Date.super_DateTime.m_time,(DateTime *)local_60);
        UtcDate::~UtcDate((UtcDate *)local_60);
        UtcDate::~UtcDate((UtcDate *)&time2Date.super_DateTime.m_time);
      }
    }
    else {
      start_local._7_1_ = false;
    }
  }
  else {
    start_local._7_1_ = false;
  }
  return start_local._7_1_;
}

Assistant:

bool TimeRange::isInSameRange(
    const DateTime &start,
    const DateTime &end,
    const DateTime &time1,
    const DateTime &time2) {
  if (!isInRange(start, end, time1)) {
    return false;
  }
  if (!isInRange(start, end, time2)) {
    return false;
  }

  if (time1 == time2) {
    return true;
  }

  if (start < end || start == end) {
    UtcDate time1Date(time1);
    UtcDate time2Date(time2);

    return time1Date == time2Date;
  } else {
    int sessionLength = DateTime::SECONDS_PER_DAY - (start - end);

    if (time1 > time2) {
      UtcTimeOnly time2TimeOnly = UtcTimeOnly(time2);

      long delta = time2TimeOnly - start;
      if (delta < 0) {
        delta = DateTime::SECONDS_PER_DAY - labs(delta);
      }

      return (time1 - time2) < (sessionLength - delta);
    } else {
      return (time2 - time1) < sessionLength;
    }
  }
}